

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize_extension_install_info.cpp
# Opt level: O2

unique_ptr<duckdb::ExtensionInstallInfo,_std::default_delete<duckdb::ExtensionInstallInfo>,_true>
__thiscall
duckdb::ExtensionInstallInfo::Deserialize(ExtensionInstallInfo *this,Deserializer *deserializer)

{
  ExtensionInstallInfo *this_00;
  pointer pEVar1;
  
  this_00 = (ExtensionInstallInfo *)operator_new(0x88);
  switchD_016d4fed::default(this_00,0,0x88);
  ExtensionInstallInfo(this_00);
  *(ExtensionInstallInfo **)this = this_00;
  pEVar1 = unique_ptr<duckdb::ExtensionInstallInfo,_std::default_delete<duckdb::ExtensionInstallInfo>,_true>
           ::operator->((unique_ptr<duckdb::ExtensionInstallInfo,_std::default_delete<duckdb::ExtensionInstallInfo>,_true>
                         *)this);
  Deserializer::ReadProperty<duckdb::ExtensionInstallMode>(deserializer,100,"mode",&pEVar1->mode);
  pEVar1 = unique_ptr<duckdb::ExtensionInstallInfo,_std::default_delete<duckdb::ExtensionInstallInfo>,_true>
           ::operator->((unique_ptr<duckdb::ExtensionInstallInfo,_std::default_delete<duckdb::ExtensionInstallInfo>,_true>
                         *)this);
  Deserializer::ReadPropertyWithDefault<std::__cxx11::string>
            (deserializer,0x65,"full_path",&pEVar1->full_path);
  pEVar1 = unique_ptr<duckdb::ExtensionInstallInfo,_std::default_delete<duckdb::ExtensionInstallInfo>,_true>
           ::operator->((unique_ptr<duckdb::ExtensionInstallInfo,_std::default_delete<duckdb::ExtensionInstallInfo>,_true>
                         *)this);
  Deserializer::ReadPropertyWithDefault<std::__cxx11::string>
            (deserializer,0x66,"repository_url",&pEVar1->repository_url);
  pEVar1 = unique_ptr<duckdb::ExtensionInstallInfo,_std::default_delete<duckdb::ExtensionInstallInfo>,_true>
           ::operator->((unique_ptr<duckdb::ExtensionInstallInfo,_std::default_delete<duckdb::ExtensionInstallInfo>,_true>
                         *)this);
  Deserializer::ReadPropertyWithDefault<std::__cxx11::string>
            (deserializer,0x67,"version",&pEVar1->version);
  pEVar1 = unique_ptr<duckdb::ExtensionInstallInfo,_std::default_delete<duckdb::ExtensionInstallInfo>,_true>
           ::operator->((unique_ptr<duckdb::ExtensionInstallInfo,_std::default_delete<duckdb::ExtensionInstallInfo>,_true>
                         *)this);
  Deserializer::ReadPropertyWithDefault<std::__cxx11::string>
            (deserializer,0x68,"etag",&pEVar1->etag);
  return (unique_ptr<duckdb::ExtensionInstallInfo,_std::default_delete<duckdb::ExtensionInstallInfo>_>
          )(unique_ptr<duckdb::ExtensionInstallInfo,_std::default_delete<duckdb::ExtensionInstallInfo>_>
            )this;
}

Assistant:

unique_ptr<ExtensionInstallInfo> ExtensionInstallInfo::Deserialize(Deserializer &deserializer) {
	auto result = duckdb::unique_ptr<ExtensionInstallInfo>(new ExtensionInstallInfo());
	deserializer.ReadProperty<ExtensionInstallMode>(100, "mode", result->mode);
	deserializer.ReadPropertyWithDefault<string>(101, "full_path", result->full_path);
	deserializer.ReadPropertyWithDefault<string>(102, "repository_url", result->repository_url);
	deserializer.ReadPropertyWithDefault<string>(103, "version", result->version);
	deserializer.ReadPropertyWithDefault<string>(104, "etag", result->etag);
	return result;
}